

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reducer_impl.cpp
# Opt level: O0

void __thiscall cilkred_map::rehash(cilkred_map *this,__cilkrts_worker *w)

{
  cilk_c_reducer_reduce_fn_t p_Var1;
  cilkred_map *in_RSI;
  bucket **in_RDI;
  elem *oel;
  bucket *b;
  size_t i;
  bucket **obuckets;
  size_t onelem;
  size_t onbuckets;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 uVar2;
  __cilkrts_worker *in_stack_ffffffffffffffc0;
  __cilkrts_worker *in_stack_ffffffffffffffc8;
  cilkred_map *in_stack_ffffffffffffffd0;
  __cilkrts_worker *view;
  __cilkrts_hyperobject_base *hb;
  bucket *key;
  __cilkrts_worker *w_00;
  
  if ((in_RSI != (cilkred_map *)0x0) || (uVar2 = true, *in_RDI != (bucket *)0x0)) {
    uVar2 = (bucket *)in_RSI[1].nelem == *in_RDI;
  }
  if ((bool)uVar2 == false) {
    __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/reducer_impl.cpp"
                  ,0x1d7,"(w == 0 && g == 0) || w->g == g");
  }
  w_00 = (__cilkrts_worker *)in_RDI[2];
  key = in_RDI[1];
  hb = (__cilkrts_hyperobject_base *)in_RDI[3];
  nextsz((size_t)in_RDI[2]);
  make_buckets(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(size_t)in_stack_ffffffffffffffc0
              );
  for (view = (__cilkrts_worker *)0x0; view < w_00;
      view = (__cilkrts_worker *)((long)&view->tail + 1)) {
    p_Var1 = (&(hb->__c_monoid).reduce_fn)[(long)view];
    if (p_Var1 != (cilk_c_reducer_reduce_fn_t)0x0) {
      for (in_stack_ffffffffffffffc0 = (__cilkrts_worker *)(p_Var1 + 8);
          in_stack_ffffffffffffffc0->tail != (__cilkrts_stack_frame **)0x0;
          in_stack_ffffffffffffffc0 = (__cilkrts_worker *)&in_stack_ffffffffffffffc0->protected_tail
          ) {
        insert_no_rehash(in_RSI,w_00,key,hb,view);
      }
    }
  }
  if (in_RDI[1] != key) {
    __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/reducer_impl.cpp"
                  ,0x1ea,"nelem == onelem");
  }
  free_buckets(in_stack_ffffffffffffffc0,in_RDI,CONCAT17(uVar2,in_stack_ffffffffffffffb0));
  return;
}

Assistant:

void cilkred_map::rehash(__cilkrts_worker *w)
{
#if REDPAR_DEBUG >= 1
    fprintf(stderr, "[W=%d, desc=rehash, this_map=%p, g=%p, w->g=%p]\n",
	    w->self, this, g, w->g);
    verify_current_wkr(w);
#endif
    CILK_ASSERT((w == 0 && g == 0) || w->g == g);
    
    size_t onbuckets = nbuckets;
    size_t onelem = nelem;
    bucket **obuckets = buckets;
    size_t i;
    bucket *b;

    make_buckets(w, nextsz(nbuckets));
     
    for (i = 0; i < onbuckets; ++i) {
        b = obuckets[i];
        if (b) {
            elem *oel;
            for (oel = b->el; oel->key; ++oel)
                insert_no_rehash(w, oel->key, oel->hb, oel->view);
        }
    }

    CILK_ASSERT(nelem == onelem);

    free_buckets(w, obuckets, onbuckets);
}